

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

unique_ptr<CMipsInstruction,_std::default_delete<CMipsInstruction>_> __thiscall
MipsParser::parseOpcode(MipsParser *this,Parser *parser)

{
  bool bVar1;
  bool bVar2;
  MipsArchType MVar3;
  Token *pTVar4;
  Identifier *args;
  string *name;
  Tokenizer *pTVar5;
  TokenizerPosition pos;
  Parser *in_RDX;
  TokenizerPosition tokenPos;
  int z;
  Identifier *identifier;
  MipsArchDefinition *arch;
  bool paramFail;
  Token *token;
  Parser *parser_local;
  MipsParser *this_local;
  
  pTVar4 = Parser::peekToken(in_RDX,0);
  if (pTVar4->type == Identifier) {
    pTVar4 = Parser::nextToken(in_RDX);
    bVar2 = false;
    MVar3 = CMipsArchitecture::GetVersion(&Mips);
    args = Token::identifierValue(pTVar4);
    tokenPos.it._M_node._4_4_ = 0;
    while (MipsOpcodes[tokenPos.it._M_node._4_4_].name != (char *)0x0) {
      if ((((((MipsOpcodes[tokenPos.it._M_node._4_4_].archs & mipsArchs[MVar3].supportSets) != 0) &&
            ((MipsOpcodes[tokenPos.it._M_node._4_4_].archs & mipsArchs[MVar3].excludeMask) == 0)) &&
           (((MipsOpcodes[tokenPos.it._M_node._4_4_].flags & 0x1000U) == 0 ||
            ((mipsArchs[MVar3].flags & 0x1000U) != 0)))) &&
          (((MipsOpcodes[tokenPos.it._M_node._4_4_].flags & 0x2000U) == 0 ||
           ((mipsArchs[MVar3].flags & 0x2000U) != 0)))) &&
         (((MipsOpcodes[tokenPos.it._M_node._4_4_].flags & 0x4000U) == 0 ||
          ((mipsArchs[MVar3].flags & 0x4000U) != 0)))) {
        name = Identifier::string_abi_cxx11_(args);
        bVar1 = decodeOpcode((MipsParser *)parser,name,MipsOpcodes + tokenPos.it._M_node._4_4_);
        if (bVar1) {
          pTVar5 = Parser::getTokenizer(in_RDX);
          pos = Tokenizer::getPosition(pTVar5);
          bVar2 = parseParameters((MipsParser *)parser,in_RDX,
                                  MipsOpcodes + tokenPos.it._M_node._4_4_);
          if (bVar2) {
            std::make_unique<CMipsInstruction,MipsOpcodeData&,MipsImmediateData&,MipsRegisterData&>
                      ((MipsOpcodeData *)this,
                       (MipsImmediateData *)
                       &parser[5].macros._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (MipsRegisterData *)
                       &parser[4].conditionStack.
                        super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
            return (__uniq_ptr_data<CMipsInstruction,_std::default_delete<CMipsInstruction>,_true,_true>
                    )(__uniq_ptr_data<CMipsInstruction,_std::default_delete<CMipsInstruction>,_true,_true>
                      )this;
          }
          pTVar5 = Parser::getTokenizer(in_RDX);
          Tokenizer::setPosition(pTVar5,pos);
          bVar2 = true;
        }
      }
      tokenPos.it._M_node._4_4_ = tokenPos.it._M_node._4_4_ + 1;
    }
    if (bVar2) {
      Parser::printError<>(in_RDX,pTVar4,"MIPS parameter failure");
    }
    else {
      Parser::printError<Identifier>(in_RDX,pTVar4,"Invalid MIPS opcode \'%s\'",args);
    }
    std::unique_ptr<CMipsInstruction,std::default_delete<CMipsInstruction>>::
    unique_ptr<std::default_delete<CMipsInstruction>,void>
              ((unique_ptr<CMipsInstruction,std::default_delete<CMipsInstruction>> *)this,
               (nullptr_t)0x0);
  }
  else {
    std::unique_ptr<CMipsInstruction,std::default_delete<CMipsInstruction>>::
    unique_ptr<std::default_delete<CMipsInstruction>,void>
              ((unique_ptr<CMipsInstruction,std::default_delete<CMipsInstruction>> *)this,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<CMipsInstruction,_std::default_delete<CMipsInstruction>,_true,_true>)
         (__uniq_ptr_data<CMipsInstruction,_std::default_delete<CMipsInstruction>,_true,_true>)this;
}

Assistant:

std::unique_ptr<CMipsInstruction> MipsParser::parseOpcode(Parser& parser)
{
	if (parser.peekToken().type != TokenType::Identifier)
		return nullptr;

	const Token &token = parser.nextToken();

	bool paramFail = false;
	const MipsArchDefinition& arch = mipsArchs[Mips.GetVersion()];
	const Identifier &identifier = token.identifierValue();

	for (int z = 0; MipsOpcodes[z].name != nullptr; z++)
	{
		if ((MipsOpcodes[z].archs & arch.supportSets) == 0)
			continue;
		if ((MipsOpcodes[z].archs & arch.excludeMask) != 0)
			continue;

		if ((MipsOpcodes[z].flags & MO_64BIT) && !(arch.flags & MO_64BIT))
			continue;
		if ((MipsOpcodes[z].flags & MO_FPU) && !(arch.flags & MO_FPU))
			continue;
		if ((MipsOpcodes[z].flags & MO_DFPU) && !(arch.flags & MO_DFPU))
			continue;

		if (decodeOpcode(identifier.string(),MipsOpcodes[z]))
		{
			TokenizerPosition tokenPos = parser.getTokenizer()->getPosition();

			if (parseParameters(parser,MipsOpcodes[z]))
			{
				// success, return opcode
				return std::make_unique<CMipsInstruction>(opcodeData,immediate,registers);
			}

			parser.getTokenizer()->setPosition(tokenPos);
			paramFail = true;
		}
	}

	if (paramFail)
		parser.printError(token, "MIPS parameter failure");
	else
		parser.printError(token, "Invalid MIPS opcode '%s'",identifier);

	return nullptr;
}